

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void ev3dev::led::set_color
               (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *group,
               vector<float,_std::allocator<float>_> *color)

{
  unsigned_long *puVar1;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *in_RDI;
  size_t i;
  size_t n;
  float in_stack_ffffffffffffffb4;
  led *in_stack_ffffffffffffffb8;
  ulong local_30;
  size_type local_28;
  size_type local_20;
  ulong local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = std::vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_>::size(in_RDI);
  local_28 = std::vector<float,_std::allocator<float>_>::size(local_10);
  puVar1 = std::min<unsigned_long>(&local_20,&local_28);
  local_18 = *puVar1;
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    std::vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_>::operator[](local_8,local_30);
    std::vector<float,_std::allocator<float>_>::operator[](local_10,local_30);
    set_brightness_pct(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    ~led((led *)0x12778b);
  }
  return;
}

Assistant:

void led::set_color(const std::vector<led*> &group, const std::vector<float> &color) {
    const size_t n = std::min(group.size(), color.size());
    for(size_t i = 0; i < n; ++i)
        group[i]->set_brightness_pct(color[i]);
}